

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v1.cpp
# Opt level: O0

ssize_t __thiscall
LASreadItemCompressed_WAVEPACKET13_v1::read
          (LASreadItemCompressed_WAVEPACKET13_v1 *this,int __fd,void *__buf,size_t __nbytes)

{
  U8 *pUVar1;
  U32 UVar2;
  I32 IVar3;
  undefined4 in_register_00000034;
  undefined1 *puVar4;
  undefined1 local_60 [8];
  LASwavepacket13 last_item_m;
  LASwavepacket13 this_item_m;
  U32 *context_local;
  U8 *item_local;
  LASreadItemCompressed_WAVEPACKET13_v1 *this_local;
  
  puVar4 = (undefined1 *)CONCAT44(in_register_00000034,__fd);
  UVar2 = ArithmeticDecoder::decodeSymbol(this->dec,this->m_packet_index);
  *puVar4 = (char)UVar2;
  LASwavepacket13::unpack((LASwavepacket13 *)local_60,this->last_item);
  UVar2 = ArithmeticDecoder::decodeSymbol(this->dec,this->m_offset_diff[this->sym_last_offset_diff])
  ;
  this->sym_last_offset_diff = UVar2;
  if (this->sym_last_offset_diff == 0) {
    last_item_m._24_8_ = local_60;
  }
  else if (this->sym_last_offset_diff == 1) {
    last_item_m._24_8_ = (long)local_60 + (ulong)(uint)last_item_m.offset;
  }
  else if (this->sym_last_offset_diff == 2) {
    IVar3 = IntegerCompressor::decompress(this->ic_offset_diff,this->last_diff_32,0);
    this->last_diff_32 = IVar3;
    last_item_m._24_8_ = (long)local_60 + (long)this->last_diff_32;
  }
  else {
    last_item_m._24_8_ = ArithmeticDecoder::readInt64(this->dec);
  }
  IntegerCompressor::decompress(this->ic_packet_size,(uint)last_item_m.offset,0);
  IntegerCompressor::decompress(this->ic_return_point,last_item_m.offset._4_4_,0);
  IntegerCompressor::decompress(this->ic_xyz,last_item_m.packet_size,0);
  IntegerCompressor::decompress(this->ic_xyz,last_item_m.return_point.i32,1);
  IntegerCompressor::decompress(this->ic_xyz,last_item_m.x.i32,2);
  LASwavepacket13::pack((LASwavepacket13 *)&last_item_m.z,puVar4 + 1);
  pUVar1 = this->last_item;
  *(undefined8 *)pUVar1 = *(undefined8 *)(puVar4 + 1);
  *(undefined8 *)(pUVar1 + 8) = *(undefined8 *)(puVar4 + 9);
  *(undefined8 *)(pUVar1 + 0x10) = *(undefined8 *)(puVar4 + 0x11);
  *(undefined4 *)(pUVar1 + 0x18) = *(undefined4 *)(puVar4 + 0x19);
  return (ssize_t)pUVar1;
}

Assistant:

inline void LASreadItemCompressed_WAVEPACKET13_v1::read(U8* item, U32& context)
{
  item[0] = (U8)(dec->decodeSymbol(m_packet_index));
  item++;

  LASwavepacket13 this_item_m;
  LASwavepacket13 last_item_m = LASwavepacket13::unpack(last_item);

  sym_last_offset_diff = dec->decodeSymbol(m_offset_diff[sym_last_offset_diff]);

  if (sym_last_offset_diff == 0)
  {
    this_item_m.offset = last_item_m.offset;
  }
  else if (sym_last_offset_diff == 1)
  {
    this_item_m.offset = last_item_m.offset + last_item_m.packet_size;
  }
  else if (sym_last_offset_diff == 2)
  {
    last_diff_32 = ic_offset_diff->decompress(last_diff_32);
    this_item_m.offset = last_item_m.offset + last_diff_32;
  }
  else
  {
    this_item_m.offset = dec->readInt64();
  }

  this_item_m.packet_size = ic_packet_size->decompress(last_item_m.packet_size);
  this_item_m.return_point.i32 = ic_return_point->decompress(last_item_m.return_point.i32);
  this_item_m.x.i32 = ic_xyz->decompress(last_item_m.x.i32, 0);
  this_item_m.y.i32 = ic_xyz->decompress(last_item_m.y.i32, 1);
  this_item_m.z.i32 = ic_xyz->decompress(last_item_m.z.i32, 2);

  this_item_m.pack(item);

  memcpy(last_item, item, 28);
}